

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessPreprocessorDirective
          (ConversionStream *this,iterator *Token)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  pointer pHVar4;
  const_iterator local_a0;
  const_iterator local_98;
  _List_node_base *local_90;
  _List_node_base *local_88;
  undefined1 local_80 [8];
  string PackMatrix;
  anon_class_1_0_00000001 ParsePragmaPackMatrix;
  undefined1 local_50 [8];
  string Directive;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_28;
  iterator DirectiveEnd;
  iterator DirectiveStart;
  iterator *Token_local;
  ConversionStream *this_local;
  
  DirectiveEnd = (iterator)Token->_M_node;
  local_28._M_node = Token->_M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_28);
  while( true ) {
    Directive.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar1 = std::operator!=(&local_28,(_Self *)((long)&Directive.field_2 + 8));
    bVar2 = false;
    if (bVar1) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_28);
      lVar3 = std::__cxx11::string::find_first_of((char *)&pHVar4->Delimiter,0xc3b2d4);
      bVar2 = lVar3 == -1;
    }
    if (!bVar2) break;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_28);
  }
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  Parsing::RefinePreprocessorDirective((string *)local_50,&pHVar4->Literal);
  bVar2 = std::operator==((string *)local_50,"pragma");
  if (bVar2) {
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    bVar2 = std::operator!=(Token,&local_28);
    if (bVar2) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      bVar2 = std::operator==(&pHVar4->Literal,"pack_matrix");
      if (bVar2) {
        local_88 = Token->_M_node;
        local_90 = local_28._M_node;
        ProcessPreprocessorDirective(std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>&)::$_0::
        operator()::HLSLTokenInfo>__const
                  ((string *)local_80,(void *)((long)&PackMatrix.field_2 + 0xb),(iterator)local_88,
                   (iterator)local_28._M_node);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"row_major");
        if (bVar2) {
          this->m_bUseRowMajorMatrices = true;
        }
        std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                  (&local_98,&DirectiveEnd);
        std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                  (&local_a0,&local_28);
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        erase(&this->m_Tokens,local_98,local_a0);
        std::__cxx11::string::~string((string *)local_80);
      }
    }
  }
  Token->_M_node = local_28._M_node;
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessPreprocessorDirective(TokenListType::iterator& Token)
{
    const TokenListType::iterator DirectiveStart = Token;

    TokenListType::iterator DirectiveEnd = Token;
    ++DirectiveEnd;
    while (DirectiveEnd != m_Tokens.end() && DirectiveEnd->Delimiter.find_first_of("\r\n") == std::string::npos)
        ++DirectiveEnd;

    const std::string Directive = RefinePreprocessorDirective(Token->Literal);
    if (Directive == "pragma")
    {
        // # pragma pack_matrix( row_major )
        // ^

        ++Token;
        // # pragma pack_matrix( row_major )
        //          ^
        if (Token != DirectiveEnd && Token->Literal == "pack_matrix")
        {
            auto ParsePragmaPackMatrix = [](TokenListType::iterator Token, TokenListType::iterator End) -> std::string {
                // # pragma pack_matrix( row_major )
                //          ^

                ++Token;
                // # pragma pack_matrix( row_major )
                //                     ^
                if (Token == End || Token->Type != TokenType::OpenParen)
                    return "";

                ++Token;
                // # pragma pack_matrix( row_major )
                //                       ^
                if (Token == End || (Token->Type != TokenType::kw_row_major && Token->Type != TokenType::kw_column_major))
                    return "";

                const std::string& PackMatrix = Token->Literal;

                ++Token;
                // # pragma pack_matrix( row_major )
                //                                 ^
                if (Token == End || Token->Type != TokenType::ClosingParen)
                    return "";

                return PackMatrix;
            };
            const std::string PackMatrix = ParsePragmaPackMatrix(Token, DirectiveEnd);
            if (PackMatrix == "row_major")
                m_bUseRowMajorMatrices = true;

            // Delete the directive
            m_Tokens.erase(DirectiveStart, DirectiveEnd);
        }
    }

    // Go to the end of the directive
    Token = DirectiveEnd;
}